

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid_Iterator.h
# Opt level: O1

void __thiscall Nova::Grid_Iterator<float,_3>::Next_Helper(Grid_Iterator<float,_3> *this)

{
  int iVar1;
  undefined8 uVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  
  iVar3 = (this->index)._data._M_elems[1];
  (this->index)._data._M_elems[2] = (this->region).min_corner._data._M_elems[2];
  piVar4 = (this->index)._data._M_elems + 1;
  if (iVar3 < (this->region).max_corner._data._M_elems[1]) {
    *piVar4 = iVar3 + 1;
    return;
  }
  uVar6 = 0;
  do {
    *piVar4 = (this->region).min_corner._data._M_elems[uVar6 + 1];
    iVar3 = (int)uVar6;
    if (iVar3 == -1) goto LAB_0011cc0f;
    uVar7 = uVar6 & 0xffffffff;
    piVar4 = (this->index)._data._M_elems + uVar7;
    iVar1 = (this->index)._data._M_elems[uVar7];
    uVar6 = uVar6 - 1;
  } while ((this->region).max_corner._data._M_elems[uVar7] <= iVar1);
  *piVar4 = iVar1 + 1;
  if (iVar3 == -1) {
LAB_0011cc0f:
    lVar5 = (long)this->current_region;
    iVar3 = this->current_region + 1;
    this->valid = iVar3 < this->number_of_regions;
    if (iVar3 < this->number_of_regions) {
      this->current_region = iVar3;
      if (lVar5 * 0x18 != -0x30) {
        uVar2 = *(undefined8 *)this->regions[lVar5 + 1].min_corner._data._M_elems;
        (this->region).min_corner._data._M_elems[2] =
             this->regions[lVar5 + 1].min_corner._data._M_elems[2];
        *(undefined8 *)(this->region).min_corner._data._M_elems = uVar2;
        uVar2 = *(undefined8 *)this->regions[lVar5 + 1].max_corner._data._M_elems;
        (this->region).max_corner._data._M_elems[2] =
             this->regions[lVar5 + 1].max_corner._data._M_elems[2];
        *(undefined8 *)(this->region).max_corner._data._M_elems = uVar2;
      }
      (this->index)._data._M_elems[2] = (this->region).min_corner._data._M_elems[2];
      *(undefined8 *)(this->index)._data._M_elems =
           *(undefined8 *)(this->region).min_corner._data._M_elems;
      return;
    }
  }
  return;
}

Assistant:

void Next_Helper()
    {
        index(d-1)=region.min_corner(d-1);
        for(int i=d-2;i>=0;--i)
        {
            if(index(i)<region.max_corner(i)){++index(i);return;}
            index(i)=region.min_corner(i);
        }
        Reset(current_region+1);
    }